

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des_store_lr(void *vp,LR lr)

{
  uint8_t *p;
  void *vp_local;
  LR lr_local;
  
  vp_local._0_4_ = lr.L;
  PUT_32BIT_MSB_FIRST(vp,(uint32_t)vp_local);
  vp_local._4_4_ = lr.R;
  PUT_32BIT_MSB_FIRST((void *)((long)vp + 4),vp_local._4_4_);
  return;
}

Assistant:

static inline void des_store_lr(void *vp, LR lr)
{
    uint8_t *p = (uint8_t *)vp;
    PUT_32BIT_MSB_FIRST(p, lr.L);
    PUT_32BIT_MSB_FIRST(p+4, lr.R);
}